

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
::expand(Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
         *this)

{
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  *ptVar1;
  _Tuple_impl<1UL,_Kernel::IntegerConstantType> *p_Var2;
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  *ptVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar4 = sVar6 * 0x30;
  if (uVar4 == 0) {
    ptVar3 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x21) {
    ptVar3 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    ptVar3 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    ptVar3 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ptVar3 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)::operator_new(uVar4,0x10);
  }
  if (this->_capacity != 0) {
    uVar4 = this->_capacity;
    if (uVar4 != 0) {
      lVar7 = 0;
      uVar5 = 0;
      do {
        std::
        _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
        ::_Tuple_impl((_Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                       *)((long)&(ptVar3->
                                 super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                                 ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                                 super__Head_base<1UL,_Kernel::IntegerConstantType,_false>.
                                 _M_head_impl._val[0]._mp_alloc + lVar7),
                      (_Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                       *)((long)&(this->_stack->
                                 super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                                 ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                                 super__Head_base<1UL,_Kernel::IntegerConstantType,_false>.
                                 _M_head_impl._val[0]._mp_alloc + lVar7));
        ptVar1 = this->_stack;
        mpz_clear((__mpz_struct *)
                  ((long)&(ptVar1->
                          super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                          ).
                          super__Head_base<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_false>
                          ._M_head_impl.numeral._val[0]._mp_alloc + lVar7));
        mpz_clear((__mpz_struct *)
                  ((long)&(ptVar1->
                          super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                          ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                          super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl.
                          _val[0]._mp_alloc + lVar7));
        uVar5 = uVar5 + 1;
        uVar4 = this->_capacity;
        lVar7 = lVar7 + 0x30;
      } while (uVar5 < uVar4);
    }
    ptVar1 = this->_stack;
    if (ptVar1 != (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                   *)0x0) {
      uVar4 = uVar4 * 0x30;
      if (uVar4 == 0) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ptVar1;
      }
      else if (uVar4 < 0x11) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ptVar1;
      }
      else if (uVar4 < 0x19) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ptVar1;
      }
      else if (uVar4 < 0x21) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ptVar1;
      }
      else if (uVar4 < 0x31) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ptVar1;
      }
      else if (uVar4 < 0x41) {
        p_Var2 = &(ptVar1->
                  super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                  ).super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ptVar1;
      }
      else {
        operator_delete(ptVar1,0x10);
      }
    }
  }
  this->_stack = ptVar3;
  this->_cursor = ptVar3 + this->_capacity;
  this->_end = ptVar3 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }